

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::average
               (void *src,int sstride,int uw,int vw,void *dst,DataType dt,int nchan)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  PtexHalf *in_RDI;
  PtexHalf *in_R8;
  undefined4 in_R9D;
  int in_stack_00000008;
  
  switch(in_R9D) {
  case 0:
    anon_unknown_1::average<unsigned_char>
              ((uchar *)in_RDI,in_ESI,in_EDX,in_ECX,(uchar *)in_R8,in_stack_00000008);
    break;
  case 1:
    anon_unknown_1::average<unsigned_short>
              (&in_RDI->bits,in_ESI,in_EDX,in_ECX,&in_R8->bits,in_stack_00000008);
    break;
  case 2:
    anon_unknown_1::average<Ptex::v2_4::PtexHalf>
              (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_stack_00000008);
    break;
  case 3:
    anon_unknown_1::average<float>
              ((float *)in_RDI,in_ESI,in_EDX,in_ECX,(float *)in_R8,in_stack_00000008);
  }
  return;
}

Assistant:

void average(const void* src, int sstride, int uw, int vw,
             void* dst, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     average(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), nchan); break;
    case dt_half:      average(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), nchan); break;
    case dt_uint16:    average(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), nchan); break;
    case dt_float:     average(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), nchan); break;
    }
}